

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

rt_expression_interface<double> * __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::diff
          (rt_variable<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *diff_var)

{
  long lVar1;
  rt_expression_interface<double> *prVar2;
  _func_int **pp_Var3;
  
  if (diff_var != (rt_expression_interface<double> *)0x0) {
    lVar1 = __dynamic_cast(diff_var,&rt_expression_interface<double>::typeinfo,
                           &rt_variable<viennamath::rt_expression_interface<double>>::typeinfo,0);
    if ((lVar1 != 0) && (*(id_type *)(lVar1 + 8) == this->id_)) {
      pp_Var3 = (_func_int **)&DAT_3ff0000000000000;
      goto LAB_0010ecba;
    }
  }
  pp_Var3 = (_func_int **)0x0;
LAB_0010ecba:
  prVar2 = (rt_expression_interface<double> *)operator_new(0x10);
  prVar2->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_expression_interface_00118540;
  prVar2[1]._vptr_rt_expression_interface = pp_Var3;
  return prVar2;
}

Assistant:

InterfaceType * diff(const InterfaceType * diff_var) const
      {
        const rt_variable<InterfaceType> * ptr = dynamic_cast< const rt_variable<InterfaceType> *>(diff_var);
        if (ptr != NULL)
        {
          //std::cout << "diff variable<" << id << ">: TRUE" << std::endl;
          if (ptr->id() == id_)
            return new rt_constant<numeric_type, InterfaceType>(1);
        }
        //std::cout << "diff variable<" << id << ">: FALSE, is: " << diff_var.get()->str() << std::endl;
        return new rt_constant<numeric_type, InterfaceType>(0);
      }